

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O2

void ImGui::Indicator(bool bOK,char *okText,char *nokText)

{
  ImVec2 IVar1;
  bool bVar2;
  undefined7 in_register_00000039;
  char *text;
  float fVar3;
  float local_28;
  
  IVar1 = GetContentRegionMax();
  fVar3 = GetWidthIconBtn(false);
  local_28 = IVar1.x;
  SetCursorPosX(local_28 - fVar3);
  text = anon_var_dwarf_1c8063;
  if ((int)CONCAT71(in_register_00000039,bOK) != 0) {
    text = anon_var_dwarf_1c8058;
  }
  TextUnformatted(text,(char *)0x0);
  bVar2 = IsItemHovered(0);
  if (bVar2) {
    if (bOK) {
      nokText = okText;
    }
    SetTooltip("%s",nokText);
    return;
  }
  return;
}

Assistant:

IMGUI_API void Indicator (bool bOK, const char* okText, const char* nokText)
{
    // right-aligned
    ImGui::SetCursorPosX(ImGui::GetContentRegionMax().x - ImGui::GetWidthIconBtn());
    // for the active line decide based on temporary check
    ImGui::TextUnformatted(bOK ? ICON_FA_CHECK_CIRCLE : ICON_FA_EXCLAMATION_TRIANGLE);
    if (ImGui::IsItemHovered())
        ImGui::SetTooltip("%s", bOK ? okText : nokText);
}